

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultClockingReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultClockingReferenceSyntax,slang::syntax::DefaultClockingReferenceSyntax_const&>
          (BumpAllocator *this,DefaultClockingReferenceSyntax *args)

{
  DefaultClockingReferenceSyntax *pDVar1;
  DefaultClockingReferenceSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pDVar1 = (DefaultClockingReferenceSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::DefaultClockingReferenceSyntax::DefaultClockingReferenceSyntax(in_RSI,pDVar1);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }